

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

void SoftForkDescPushBack
               (CBlockIndex *blockindex,UniValue *softforks,ChainstateManager *chainman,
               DeploymentPos id)

{
  long lVar1;
  string str;
  string key;
  string key_00;
  string key_01;
  string key_02;
  string key_03;
  string key_04;
  string key_05;
  string str_00;
  string key_06;
  string key_07;
  string key_08;
  string key_09;
  string key_10;
  string key_11;
  string key_12;
  string str_01;
  string key_13;
  string key_14;
  string key_15;
  string key_16;
  string key_17;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  UniValue val_04;
  UniValue val_05;
  UniValue val_06;
  UniValue val_07;
  UniValue val_08;
  UniValue val_09;
  UniValue val_10;
  UniValue val_11;
  UniValue val_12;
  UniValue val_13;
  UniValue val_14;
  UniValue val_15;
  UniValue val_16;
  UniValue val_17;
  _Bit_type *p_Var2;
  uint uVar3;
  bool bVar4;
  ThresholdState TVar5;
  ThresholdState TVar6;
  uint uVar7;
  ThresholdState state;
  ThresholdState state_00;
  ulong *puVar8;
  char __c;
  uint uVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffff538;
  undefined8 in_stack_fffffffffffff540;
  ChainstateManager *pCVar11;
  undefined4 in_stack_fffffffffffff548;
  ThresholdState in_stack_fffffffffffff54c;
  undefined8 in_stack_fffffffffffff550;
  VersionBitsCache *this;
  CBlockIndex *local_aa8;
  ulong local_aa0;
  UniValue *local_a98;
  undefined1 auStack_a90 [4];
  BIP9Stats statsStruct;
  vector<bool,_std::allocator<bool>_> signals;
  UniValue local_a50;
  string local_9f8;
  UniValue local_9d8;
  string local_980 [32];
  UniValue local_960;
  string local_908 [32];
  UniValue local_8e8;
  string local_890 [32];
  UniValue local_870;
  string local_818 [32];
  undefined1 *local_7f8;
  undefined8 local_7f0;
  undefined1 local_7e8 [16];
  UniValue local_7d8;
  string local_780 [32];
  string sig;
  UniValue local_740;
  string local_6e8 [32];
  UniValue local_6c8;
  string local_670 [32];
  UniValue local_650;
  string local_5f8 [32];
  UniValue local_5d8;
  string local_580 [32];
  UniValue local_560;
  string local_508 [32];
  UniValue local_4e8;
  string local_490 [32];
  undefined1 *local_470;
  undefined8 local_468;
  undefined1 local_460 [16];
  UniValue rv;
  UniValue local_3f8;
  string local_3a0 [32];
  UniValue local_380;
  string local_328 [32];
  UniValue local_308;
  string local_2b0 [32];
  UniValue local_290;
  string local_238 [32];
  UniValue local_218;
  string local_1c0 [32];
  UniValue local_1a0;
  string local_148 [32];
  UniValue local_128;
  string local_d0 [32];
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [16];
  UniValue bip9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = DeploymentEnabled<Consensus::DeploymentPos>(chainman,id);
  if ((blockindex != (CBlockIndex *)0x0) && (bVar4)) {
    local_b0 = local_a0;
    local_a8 = 0;
    local_a0[0] = 0;
    str._M_string_length = in_stack_fffffffffffff540;
    str._M_dataplus._M_p = (pointer)in_stack_fffffffffffff538;
    str.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff548;
    str.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff54c;
    str.field_2._8_8_ = in_stack_fffffffffffff550;
    UniValue::UniValue(&bip9,VOBJ,str);
    std::__cxx11::string::~string((string *)&local_b0);
    this = &chainman->m_versionbitscache;
    TVar5 = VersionBitsCache::State
                      (this,blockindex,&((chainman->m_options).chainparams)->consensus,id);
    TVar6 = VersionBitsCache::State
                      (this,blockindex->pprev,&((chainman->m_options).chainparams)->consensus,id);
    if (TVar6 - STARTED < 2) {
      std::__cxx11::string::string<std::allocator<char>>(local_d0,"bit",(allocator<char> *)&rv);
      UniValue::UniValue<const_int_&,_int,_true>
                (&local_128,&(((chainman->m_options).chainparams)->consensus).vDeployments[id].bit);
      key._M_string_length = (size_type)chainman;
      key._M_dataplus._M_p = (pointer)in_stack_fffffffffffff538;
      key.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff548;
      key.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff54c;
      key.field_2._8_8_ = this;
      val.val._M_dataplus._M_p = (pointer)local_aa0;
      val._0_8_ = local_aa8;
      val.val._M_string_length = (size_type)local_a98;
      val.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )_auStack_a90;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)statsStruct._12_8_;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
           (int)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p._4_4_;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_offset;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._12_4_;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._12_4_;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage;
      UniValue::pushKV(&bip9,key,val);
      UniValue::~UniValue(&local_128);
      std::__cxx11::string::~string(local_d0);
    }
    std::__cxx11::string::string<std::allocator<char>>
              (local_148,"start_time",(allocator<char> *)&rv);
    UniValue::UniValue<const_long_&,_long,_true>
              (&local_1a0,
               &(((chainman->m_options).chainparams)->consensus).vDeployments[id].nStartTime);
    key_00._M_string_length = (size_type)chainman;
    key_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff538;
    key_00.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff548;
    key_00.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff54c;
    key_00.field_2._8_8_ = this;
    val_00.val._M_dataplus._M_p = (pointer)local_aa0;
    val_00._0_8_ = local_aa8;
    val_00.val._M_string_length = (size_type)local_a98;
    val_00.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )_auStack_a90;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)statsStruct._12_8_;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
         (int)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p._4_4_;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_offset;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._12_4_;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._M_offset;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._12_4_;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage;
    UniValue::pushKV(&bip9,key_00,val_00);
    UniValue::~UniValue(&local_1a0);
    std::__cxx11::string::~string(local_148);
    std::__cxx11::string::string<std::allocator<char>>(local_1c0,"timeout",(allocator<char> *)&rv);
    UniValue::UniValue<const_long_&,_long,_true>
              (&local_218,
               &(((chainman->m_options).chainparams)->consensus).vDeployments[id].nTimeout);
    key_01._M_string_length = (size_type)chainman;
    key_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff538;
    key_01.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff548;
    key_01.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff54c;
    key_01.field_2._8_8_ = this;
    val_01.val._M_dataplus._M_p = (pointer)local_aa0;
    val_01._0_8_ = local_aa8;
    val_01.val._M_string_length = (size_type)local_a98;
    val_01.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )_auStack_a90;
    val_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)statsStruct._12_8_;
    val_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
         (int)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p;
    val_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p._4_4_;
    val_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_offset;
    val_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._12_4_;
    val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._M_offset;
    val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._12_4_;
    val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage;
    UniValue::pushKV(&bip9,key_01,val_01);
    UniValue::~UniValue(&local_218);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::string::string<std::allocator<char>>
              (local_238,"min_activation_height",(allocator<char> *)&rv);
    UniValue::UniValue<const_int_&,_int,_true>
              (&local_290,
               &(((chainman->m_options).chainparams)->consensus).vDeployments[id].
                min_activation_height);
    key_02._M_string_length = (size_type)chainman;
    key_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff538;
    key_02.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff548;
    key_02.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff54c;
    key_02.field_2._8_8_ = this;
    val_02.val._M_dataplus._M_p = (pointer)local_aa0;
    val_02._0_8_ = local_aa8;
    val_02.val._M_string_length = (size_type)local_a98;
    val_02.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )_auStack_a90;
    val_02.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)statsStruct._12_8_;
    val_02.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
         (int)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p;
    val_02.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p._4_4_;
    val_02.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_offset;
    val_02.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._12_4_;
    val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._M_offset;
    val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._12_4_;
    val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage;
    UniValue::pushKV(&bip9,key_02,val_02);
    UniValue::~UniValue(&local_290);
    std::__cxx11::string::~string(local_238);
    std::__cxx11::string::string<std::allocator<char>>
              (local_2b0,"status",(allocator<char> *)&signals);
    SoftForkDescPushBack(CBlockIndex_const*,UniValue&,ChainstateManager_const&,Consensus::DeploymentPos)
    ::$_0::operator()[abi_cxx11_((string *)&rv,(void *)(ulong)TVar6,state);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_308,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv);
    key_03._M_string_length = (size_type)chainman;
    key_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff538;
    key_03.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff548;
    key_03.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff54c;
    key_03.field_2._8_8_ = this;
    val_03.val._M_dataplus._M_p = (pointer)local_aa0;
    val_03._0_8_ = local_aa8;
    val_03.val._M_string_length = (size_type)local_a98;
    val_03.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )_auStack_a90;
    val_03.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)statsStruct._12_8_;
    val_03.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
         (int)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p;
    val_03.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p._4_4_;
    val_03.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_offset;
    val_03.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._12_4_;
    val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._M_offset;
    val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._12_4_;
    val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage;
    UniValue::pushKV(&bip9,key_03,val_03);
    UniValue::~UniValue(&local_308);
    std::__cxx11::string::~string((string *)&rv);
    std::__cxx11::string::~string(local_2b0);
    std::__cxx11::string::string<std::allocator<char>>
              (local_328,"since",(allocator<char> *)&signals);
    rv.typ = VersionBitsCache::StateSinceHeight
                       (this,blockindex->pprev,&((chainman->m_options).chainparams)->consensus,id);
    UniValue::UniValue<int,_int,_true>(&local_380,(int *)&rv);
    key_04._M_string_length = (size_type)chainman;
    key_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff538;
    key_04.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff548;
    key_04.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff54c;
    key_04.field_2._8_8_ = this;
    val_04.val._M_dataplus._M_p = (pointer)local_aa0;
    val_04._0_8_ = local_aa8;
    val_04.val._M_string_length = (size_type)local_a98;
    val_04.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )_auStack_a90;
    val_04.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)statsStruct._12_8_;
    val_04.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
         (int)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p;
    val_04.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p._4_4_;
    val_04.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_offset;
    val_04.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._12_4_;
    val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._M_offset;
    val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._12_4_;
    val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage;
    UniValue::pushKV(&bip9,key_04,val_04);
    UniValue::~UniValue(&local_380);
    std::__cxx11::string::~string(local_328);
    std::__cxx11::string::string<std::allocator<char>>
              (local_3a0,"status_next",(allocator<char> *)&signals);
    SoftForkDescPushBack(CBlockIndex_const*,UniValue&,ChainstateManager_const&,Consensus::DeploymentPos)
    ::$_0::operator()[abi_cxx11_((string *)&rv,(void *)(ulong)TVar5,state_00);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_3f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rv);
    key_05._M_string_length = (size_type)chainman;
    key_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff538;
    key_05.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff548;
    key_05.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff54c;
    key_05.field_2._8_8_ = this;
    val_05.val._M_dataplus._M_p = (pointer)local_aa0;
    val_05._0_8_ = local_aa8;
    val_05.val._M_string_length = (size_type)local_a98;
    val_05.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )_auStack_a90;
    val_05.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)statsStruct._12_8_;
    val_05.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
         (int)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p;
    val_05.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p._4_4_;
    val_05.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_offset;
    val_05.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._12_4_;
    val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._M_offset;
    val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._12_4_;
    val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage;
    UniValue::pushKV(&bip9,key_05,val_05);
    UniValue::~UniValue(&local_3f8);
    std::__cxx11::string::~string((string *)&rv);
    std::__cxx11::string::~string(local_3a0);
    if (TVar6 - STARTED < 2) {
      local_470 = local_460;
      local_468 = 0;
      local_460[0] = 0;
      str_00._M_string_length = (size_type)chainman;
      str_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff538;
      str_00.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff548;
      str_00.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff54c;
      str_00.field_2._8_8_ = this;
      UniValue::UniValue(&rv,VOBJ,str_00);
      std::__cxx11::string::~string((string *)&local_470);
      signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p._0_4_ = 0;
      signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p._4_4_ = 0;
      signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_offset = 0;
      signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      VersionBitsCache::Statistics
                (&statsStruct,blockindex,&((chainman->m_options).chainparams)->consensus,id,&signals
                );
      std::__cxx11::string::string<std::allocator<char>>(local_490,"period",(allocator<char> *)&sig)
      ;
      UniValue::UniValue<int_&,_int,_true>(&local_4e8,&statsStruct.period);
      key_06._M_string_length = (size_type)chainman;
      key_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff538;
      key_06.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff548;
      key_06.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff54c;
      key_06.field_2._8_8_ = this;
      val_06.val._M_dataplus._M_p = (pointer)local_aa0;
      val_06._0_8_ = local_aa8;
      val_06.val._M_string_length = (size_type)local_a98;
      val_06.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )_auStack_a90;
      val_06.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)statsStruct._12_8_;
      val_06.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
           (int)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p;
      val_06.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p._4_4_;
      val_06.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_offset;
      val_06.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._12_4_;
      val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
      val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
      val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._12_4_;
      val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage;
      UniValue::pushKV(&rv,key_06,val_06);
      UniValue::~UniValue(&local_4e8);
      std::__cxx11::string::~string(local_490);
      std::__cxx11::string::string<std::allocator<char>>
                (local_508,"elapsed",(allocator<char> *)&sig);
      UniValue::UniValue<int_&,_int,_true>(&local_560,&statsStruct.elapsed);
      key_07._M_string_length = (size_type)chainman;
      key_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff538;
      key_07.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff548;
      key_07.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff54c;
      key_07.field_2._8_8_ = this;
      val_07.val._M_dataplus._M_p = (pointer)local_aa0;
      val_07._0_8_ = local_aa8;
      val_07.val._M_string_length = (size_type)local_a98;
      val_07.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )_auStack_a90;
      val_07.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)statsStruct._12_8_;
      val_07.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
           (int)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p;
      val_07.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p._4_4_;
      val_07.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_offset;
      val_07.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._12_4_;
      val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
      val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
      val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._12_4_;
      val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage;
      UniValue::pushKV(&rv,key_07,val_07);
      UniValue::~UniValue(&local_560);
      std::__cxx11::string::~string(local_508);
      std::__cxx11::string::string<std::allocator<char>>(local_580,"count",(allocator<char> *)&sig);
      UniValue::UniValue<int_&,_int,_true>(&local_5d8,&statsStruct.count);
      key_08._M_string_length = (size_type)chainman;
      key_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff538;
      key_08.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff548;
      key_08.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff54c;
      key_08.field_2._8_8_ = this;
      val_08.val._M_dataplus._M_p = (pointer)local_aa0;
      val_08._0_8_ = local_aa8;
      val_08.val._M_string_length = (size_type)local_a98;
      val_08.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )_auStack_a90;
      val_08.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)statsStruct._12_8_;
      val_08.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
           (int)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p;
      val_08.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p._4_4_;
      val_08.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_offset;
      val_08.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._12_4_;
      val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
      val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
      val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._12_4_;
      val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage;
      UniValue::pushKV(&rv,key_08,val_08);
      UniValue::~UniValue(&local_5d8);
      std::__cxx11::string::~string(local_580);
      if (TVar6 != LOCKED_IN) {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_5f8,"threshold",(allocator<char> *)&sig);
        UniValue::UniValue<int_&,_int,_true>(&local_650,&statsStruct.threshold);
        key_09._M_string_length = (size_type)chainman;
        key_09._M_dataplus._M_p = (pointer)in_stack_fffffffffffff538;
        key_09.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff548;
        key_09.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff54c;
        key_09.field_2._8_8_ = this;
        val_09.val._M_dataplus._M_p = (pointer)local_aa0;
        val_09._0_8_ = local_aa8;
        val_09.val._M_string_length = (size_type)local_a98;
        val_09.val.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )_auStack_a90;
        val_09.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)statsStruct._12_8_;
        val_09.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
             (int)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        val_09.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
             signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p._4_4_;
        val_09.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_offset;
        val_09.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._12_4_;
        val_09.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
        val_09.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ =
             signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset;
        val_09.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ =
             signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._12_4_;
        val_09.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage;
        UniValue::pushKV(&rv,key_09,val_09);
        UniValue::~UniValue(&local_650);
        std::__cxx11::string::~string(local_5f8);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_670,"possible",(allocator<char> *)&sig);
        UniValue::UniValue<bool_&,_bool,_true>(&local_6c8,&statsStruct.possible);
        key_10._M_string_length = (size_type)chainman;
        key_10._M_dataplus._M_p = (pointer)in_stack_fffffffffffff538;
        key_10.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff548;
        key_10.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff54c;
        key_10.field_2._8_8_ = this;
        val_10.val._M_dataplus._M_p = (pointer)local_aa0;
        val_10._0_8_ = local_aa8;
        val_10.val._M_string_length = (size_type)local_a98;
        val_10.val.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )_auStack_a90;
        val_10.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)statsStruct._12_8_;
        val_10.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
             (int)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        val_10.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
             signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p._4_4_;
        val_10.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_offset;
        val_10.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._12_4_;
        val_10.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
        val_10.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ =
             signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset;
        val_10.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ =
             signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._12_4_;
        val_10.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage;
        UniValue::pushKV(&rv,key_10,val_10);
        UniValue::~UniValue(&local_6c8);
        std::__cxx11::string::~string(local_670);
      }
      std::__cxx11::string::string<std::allocator<char>>
                (local_6e8,"statistics",(allocator<char> *)&sig);
      UniValue::UniValue(&local_740,&rv);
      key_11._M_string_length = (size_type)chainman;
      key_11._M_dataplus._M_p = (pointer)in_stack_fffffffffffff538;
      key_11.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff548;
      key_11.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff54c;
      key_11.field_2._8_8_ = this;
      val_11.val._M_dataplus._M_p = (pointer)local_aa0;
      val_11._0_8_ = local_aa8;
      val_11.val._M_string_length = (size_type)local_a98;
      val_11.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )_auStack_a90;
      val_11.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)statsStruct._12_8_;
      val_11.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
           (int)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p;
      val_11.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p._4_4_;
      val_11.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_offset;
      val_11.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._12_4_;
      val_11.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
      val_11.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
      val_11.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._12_4_;
      val_11.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage;
      UniValue::pushKV(&bip9,key_11,val_11);
      UniValue::~UniValue(&local_740);
      std::__cxx11::string::~string(local_6e8);
      sig._M_dataplus._M_p = (pointer)&sig.field_2;
      sig._M_string_length = 0;
      sig.field_2._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                (&sig,(ulong)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                      ((long)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                      CONCAT44(signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_
                               ,(int)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                              )) * 8);
      uVar3 = signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset;
      p_Var2 = signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_finish.super__Bit_iterator_base._M_p;
      puVar8 = (ulong *)CONCAT44(signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p.
                                 _4_4_,(int)signals.super__Bvector_base<std::allocator<bool>_>.
                                            _M_impl.super__Bvector_impl_data._M_start.
                                            super__Bit_iterator_base._M_p);
      uVar10 = 0;
      while ((uVar9 = (uint)uVar10, puVar8 != p_Var2 || (uVar9 != uVar3))) {
        __c = '-';
        if ((*puVar8 >> (uVar10 & 0x3f) & 1) != 0) {
          __c = '#';
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&sig,__c);
        uVar7 = uVar9 + 1;
        puVar8 = puVar8 + (uVar9 == 0x3f);
        if (uVar9 == 0x3f) {
          uVar7 = 0;
        }
        uVar10 = (ulong)uVar7;
      }
      std::__cxx11::string::string<std::allocator<char>>
                (local_780,"signalling",(allocator<char> *)(auStack_a90 + 3));
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_7d8,&sig);
      key_12._M_string_length = (size_type)chainman;
      key_12._M_dataplus._M_p = (pointer)in_stack_fffffffffffff538;
      key_12.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff548;
      key_12.field_2._M_allocated_capacity._4_4_ = TVar5;
      key_12.field_2._8_8_ = this;
      val_12.val._M_dataplus._M_p._0_2_ = id;
      val_12._0_8_ = blockindex;
      val_12.val._M_dataplus._M_p._2_6_ = 0;
      val_12.val._M_string_length = (size_type)softforks;
      val_12.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )_auStack_a90;
      val_12.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)statsStruct._12_8_;
      val_12.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
           (int)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p;
      val_12.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p._4_4_;
      val_12.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_offset;
      val_12.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._12_4_;
      val_12.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
      val_12.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
      val_12.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._12_4_;
      val_12.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage;
      in_stack_fffffffffffff54c = TVar5;
      UniValue::pushKV(&bip9,key_12,val_12);
      UniValue::~UniValue(&local_7d8);
      std::__cxx11::string::~string(local_780);
      std::__cxx11::string::~string((string *)&sig);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&signals.super__Bvector_base<std::allocator<bool>_>);
      UniValue::~UniValue(&rv);
      local_aa8 = blockindex;
      local_aa0 = (ulong)id;
      local_a98 = softforks;
    }
    local_7f8 = local_7e8;
    local_7f0 = 0;
    local_7e8[0] = 0;
    str_01._M_string_length = (size_type)chainman;
    str_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff538;
    str_01.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff548;
    str_01.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff54c;
    str_01.field_2._8_8_ = this;
    UniValue::UniValue(&rv,VOBJ,str_01);
    std::__cxx11::string::~string((string *)&local_7f8);
    std::__cxx11::string::string<std::allocator<char>>(local_818,"type",(allocator<char> *)&signals)
    ;
    UniValue::UniValue<const_char_(&)[5],_char[5],_true>(&local_870,(char (*) [5])"bip9");
    key_13._M_string_length = (size_type)chainman;
    key_13._M_dataplus._M_p = (pointer)in_stack_fffffffffffff538;
    key_13.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff548;
    key_13.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff54c;
    key_13.field_2._8_8_ = this;
    val_13.val._M_dataplus._M_p = (pointer)local_aa0;
    val_13._0_8_ = local_aa8;
    val_13.val._M_string_length = (size_type)local_a98;
    val_13.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )_auStack_a90;
    val_13.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)statsStruct._12_8_;
    val_13.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
         (int)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p;
    val_13.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p._4_4_;
    val_13.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_offset;
    val_13.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._12_4_;
    val_13.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    val_13.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._M_offset;
    val_13.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._12_4_;
    val_13.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage;
    pCVar11 = chainman;
    UniValue::pushKV(&rv,key_13,val_13);
    UniValue::~UniValue(&local_870);
    std::__cxx11::string::~string(local_818);
    if (TVar5 == ACTIVE) {
      std::__cxx11::string::string<std::allocator<char>>(local_890,"height",(allocator<char> *)&sig)
      ;
      signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p._0_4_ =
           VersionBitsCache::StateSinceHeight
                     (this,blockindex,&((chainman->m_options).chainparams)->consensus,id);
      UniValue::UniValue<int,_int,_true>(&local_8e8,(int *)&signals);
      key_14._M_string_length = (size_type)pCVar11;
      key_14._M_dataplus._M_p = (pointer)in_stack_fffffffffffff538;
      key_14.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff548;
      key_14.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff54c;
      key_14.field_2._8_8_ = this;
      val_14.val._M_dataplus._M_p = (pointer)local_aa0;
      val_14._0_8_ = local_aa8;
      val_14.val._M_string_length = (size_type)local_a98;
      val_14.val.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )_auStack_a90;
      val_14.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)statsStruct._12_8_;
      val_14.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
           (int)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p;
      val_14.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p._4_4_;
      val_14.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_offset;
      val_14.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._12_4_;
      val_14.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
      val_14.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
      val_14.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ =
           signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._12_4_;
      val_14.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage;
      UniValue::pushKV(&rv,key_14,val_14);
      UniValue::~UniValue(&local_8e8);
      std::__cxx11::string::~string(local_890);
    }
    std::__cxx11::string::string<std::allocator<char>>
              (local_908,"active",(allocator<char> *)&signals);
    sig._M_dataplus._M_p._0_1_ = TVar5 == ACTIVE;
    UniValue::UniValue<bool,_bool,_true>(&local_960,(bool *)&sig);
    key_15._M_string_length = (size_type)pCVar11;
    key_15._M_dataplus._M_p = (pointer)in_stack_fffffffffffff538;
    key_15.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff548;
    key_15.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff54c;
    key_15.field_2._8_8_ = this;
    val_15.val._M_dataplus._M_p = (pointer)local_aa0;
    val_15._0_8_ = local_aa8;
    val_15.val._M_string_length = (size_type)local_a98;
    val_15.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )_auStack_a90;
    val_15.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)statsStruct._12_8_;
    val_15.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
         (int)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p;
    val_15.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p._4_4_;
    val_15.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_offset;
    val_15.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._12_4_;
    val_15.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    val_15.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._M_offset;
    val_15.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._12_4_;
    val_15.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage;
    UniValue::pushKV(&rv,key_15,val_15);
    UniValue::~UniValue(&local_960);
    std::__cxx11::string::~string(local_908);
    std::__cxx11::string::string<std::allocator<char>>(local_980,"bip9",(allocator<char> *)&signals)
    ;
    UniValue::UniValue(&local_9d8,&bip9);
    key_16._M_string_length = (size_type)pCVar11;
    key_16._M_dataplus._M_p = (pointer)in_stack_fffffffffffff538;
    key_16.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff548;
    key_16.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff54c;
    key_16.field_2._8_8_ = this;
    val_16.val._M_dataplus._M_p = (pointer)local_aa0;
    val_16._0_8_ = local_aa8;
    val_16.val._M_string_length = (size_type)local_a98;
    val_16.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )_auStack_a90;
    val_16.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)statsStruct._12_8_;
    val_16.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
         (int)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p;
    val_16.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p._4_4_;
    val_16.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_offset;
    val_16.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._12_4_;
    val_16.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    val_16.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._M_offset;
    val_16.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._12_4_;
    val_16.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage;
    UniValue::pushKV(&rv,key_16,val_16);
    UniValue::~UniValue(&local_9d8);
    std::__cxx11::string::~string(local_980);
    DeploymentName_abi_cxx11_(&local_9f8,id);
    UniValue::UniValue(&local_a50,&rv);
    key_17._M_string_length = (size_type)pCVar11;
    key_17._M_dataplus._M_p = (pointer)in_stack_fffffffffffff538;
    key_17.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff548;
    key_17.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff54c;
    key_17.field_2._8_8_ = this;
    val_17.val._M_dataplus._M_p = (pointer)local_aa0;
    val_17._0_8_ = local_aa8;
    val_17.val._M_string_length = (size_type)local_a98;
    val_17.val.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )_auStack_a90;
    val_17.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)statsStruct._12_8_;
    val_17.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
         (int)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p;
    val_17.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p._4_4_;
    val_17.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_offset;
    val_17.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._12_4_;
    val_17.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    val_17.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._M_offset;
    val_17.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ =
         signals.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._12_4_;
    val_17.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)signals.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage;
    UniValue::pushKV(softforks,key_17,val_17);
    UniValue::~UniValue(&local_a50);
    std::__cxx11::string::~string((string *)&local_9f8);
    UniValue::~UniValue(&rv);
    UniValue::~UniValue(&bip9);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SoftForkDescPushBack(const CBlockIndex* blockindex, UniValue& softforks, const ChainstateManager& chainman, Consensus::DeploymentPos id)
{
    // For BIP9 deployments.

    if (!DeploymentEnabled(chainman, id)) return;
    if (blockindex == nullptr) return;

    auto get_state_name = [](const ThresholdState state) -> std::string {
        switch (state) {
        case ThresholdState::DEFINED: return "defined";
        case ThresholdState::STARTED: return "started";
        case ThresholdState::LOCKED_IN: return "locked_in";
        case ThresholdState::ACTIVE: return "active";
        case ThresholdState::FAILED: return "failed";
        }
        return "invalid";
    };

    UniValue bip9(UniValue::VOBJ);

    const ThresholdState next_state = chainman.m_versionbitscache.State(blockindex, chainman.GetConsensus(), id);
    const ThresholdState current_state = chainman.m_versionbitscache.State(blockindex->pprev, chainman.GetConsensus(), id);

    const bool has_signal = (ThresholdState::STARTED == current_state || ThresholdState::LOCKED_IN == current_state);

    // BIP9 parameters
    if (has_signal) {
        bip9.pushKV("bit", chainman.GetConsensus().vDeployments[id].bit);
    }
    bip9.pushKV("start_time", chainman.GetConsensus().vDeployments[id].nStartTime);
    bip9.pushKV("timeout", chainman.GetConsensus().vDeployments[id].nTimeout);
    bip9.pushKV("min_activation_height", chainman.GetConsensus().vDeployments[id].min_activation_height);

    // BIP9 status
    bip9.pushKV("status", get_state_name(current_state));
    bip9.pushKV("since", chainman.m_versionbitscache.StateSinceHeight(blockindex->pprev, chainman.GetConsensus(), id));
    bip9.pushKV("status_next", get_state_name(next_state));

    // BIP9 signalling status, if applicable
    if (has_signal) {
        UniValue statsUV(UniValue::VOBJ);
        std::vector<bool> signals;
        BIP9Stats statsStruct = chainman.m_versionbitscache.Statistics(blockindex, chainman.GetConsensus(), id, &signals);
        statsUV.pushKV("period", statsStruct.period);
        statsUV.pushKV("elapsed", statsStruct.elapsed);
        statsUV.pushKV("count", statsStruct.count);
        if (ThresholdState::LOCKED_IN != current_state) {
            statsUV.pushKV("threshold", statsStruct.threshold);
            statsUV.pushKV("possible", statsStruct.possible);
        }
        bip9.pushKV("statistics", std::move(statsUV));

        std::string sig;
        sig.reserve(signals.size());
        for (const bool s : signals) {
            sig.push_back(s ? '#' : '-');
        }
        bip9.pushKV("signalling", sig);
    }

    UniValue rv(UniValue::VOBJ);
    rv.pushKV("type", "bip9");
    if (ThresholdState::ACTIVE == next_state) {
        rv.pushKV("height", chainman.m_versionbitscache.StateSinceHeight(blockindex, chainman.GetConsensus(), id));
    }
    rv.pushKV("active", ThresholdState::ACTIVE == next_state);
    rv.pushKV("bip9", std::move(bip9));

    softforks.pushKV(DeploymentName(id), std::move(rv));
}